

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int matchshreg(match *res,reg *reg,easm_expr *expr,int shl,iasctx *ctx)

{
  int iVar1;
  ulong local_50;
  ull num_1;
  ull num;
  ull sh;
  iasctx *ctx_local;
  easm_expr *peStack_28;
  int shl_local;
  easm_expr *expr_local;
  reg *reg_local;
  match *res_local;
  
  num = 0;
  peStack_28 = expr;
  while( true ) {
    while( true ) {
      while ((peStack_28->type == EASM_EXPR_SHL && (peStack_28->e2->type == EASM_EXPR_NUM))) {
        num = peStack_28->e2->num + num;
        peStack_28 = peStack_28->e1;
      }
      if ((peStack_28->type != EASM_EXPR_MUL) || (peStack_28->e2->type != EASM_EXPR_NUM)) break;
      num_1 = peStack_28->e2->num;
      if ((num_1 == 0) || ((num_1 & num_1 - 1) != 0)) {
        return 0;
      }
      for (; num_1 != 1; num_1 = num_1 >> 1) {
        num = num + 1;
      }
      peStack_28 = peStack_28->e1;
    }
    if ((peStack_28->type != EASM_EXPR_MUL) || (peStack_28->e1->type != EASM_EXPR_NUM)) break;
    local_50 = peStack_28->e1->num;
    if ((local_50 == 0) || ((local_50 & local_50 - 1) != 0)) {
      return 0;
    }
    for (; local_50 != 1; local_50 = local_50 >> 1) {
      num = num + 1;
    }
    peStack_28 = peStack_28->e2;
  }
  if (num != (long)shl) {
    return 0;
  }
  iVar1 = matchreg(res,reg,peStack_28,ctx);
  return iVar1;
}

Assistant:

int matchshreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, int shl, struct iasctx *ctx) {
	ull sh = 0;
	while (1) {
		if (expr->type == EASM_EXPR_SHL && expr->e2->type == EASM_EXPR_NUM) {
			sh += expr->e2->num;
			expr = expr->e1;
		} else if (expr->type == EASM_EXPR_MUL && expr->e2->type == EASM_EXPR_NUM) {
			ull num = expr->e2->num;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->e1;
		} else if (expr->type == EASM_EXPR_MUL && expr->e1->type == EASM_EXPR_NUM) {
			ull num = expr->e1->num;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->e2;
		} else {
			break;
		}
	}
	if (sh != shl)
		return 0;
	return matchreg(res, reg, expr, ctx);
}